

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Sendrecv_replace
              (void *buf,int count,MPIABI_Datatype datatype,int dest,int sendtag,int source,
              int recvtag,MPIABI_Comm comm,MPIABI_Status *status)

{
  int iVar1;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Sendrecv_replace();
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Sendrecv_replace(
  void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int sendtag,
  int source,
  int recvtag,
  MPIABI_Comm comm,
  MPIABI_Status * status
) {
  return MPI_Sendrecv_replace(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    sendtag,
    source,
    recvtag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}